

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  Stream *pSVar1;
  StringRef Val;
  StringRef Value;
  StringRef RawVal;
  StringRef Tag;
  StringRef Anchor;
  StringRef Tag_00;
  StringRef Anchor_00;
  StringRef Tag_01;
  StringRef Anchor_01;
  StringRef Tag_02;
  StringRef Anchor_02;
  StringRef Tag_03;
  StringRef Anchor_03;
  StringRef Tag_04;
  StringRef Anchor_04;
  StringRef Tag_05;
  StringRef Anchor_05;
  StringRef Tag_06;
  StringRef Anchor_06;
  StringRef Val_00;
  Token *pTVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  long lVar5;
  Document *pDVar6;
  char *pcVar7;
  Document *local_928;
  Document *local_900;
  Document *local_8c8;
  Document *local_888;
  Document *local_860;
  Document *local_838;
  Document *local_810;
  Document *local_7e8;
  Document *local_7c0;
  Document *local_790;
  StringRef local_718;
  char *local_708;
  StringRef StrCopy;
  StringRef NullTerminatedStr;
  Token local_680;
  undefined1 local_648 [88];
  undefined1 local_5f0 [88];
  undefined1 local_598 [88];
  undefined1 local_540 [88];
  undefined1 local_4e8 [88];
  Twine local_490;
  Token local_478;
  Twine local_440;
  undefined4 local_424;
  char *local_420;
  size_t local_418;
  Token local_410;
  undefined1 local_3d8 [8];
  Token TagInfo;
  Token AnchorInfo;
  Token T;
  Document *this_local;
  unsigned_long local_308 [3];
  Token *local_2f0;
  undefined1 local_2e8 [16];
  size_t local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  unsigned_long local_2c0 [3];
  Token *local_2a8;
  undefined1 local_2a0 [16];
  size_t local_290;
  char *local_288;
  undefined1 *local_280;
  unsigned_long local_278 [3];
  Token *local_260;
  undefined1 local_258 [16];
  size_t local_248;
  char *local_240;
  undefined1 *local_238;
  unsigned_long local_230 [3];
  Token *local_218;
  undefined1 local_210 [16];
  size_t local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  unsigned_long local_1e8 [3];
  Token *local_1d0;
  undefined1 local_1c8 [16];
  size_t local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  unsigned_long local_1a0 [3];
  Token *local_188;
  undefined1 local_180 [16];
  size_t local_170;
  char *local_168;
  undefined1 *local_160;
  unsigned_long local_158 [3];
  Token *local_140;
  undefined1 local_138 [16];
  size_t local_128;
  char *local_120;
  undefined1 *local_118;
  unsigned_long local_110 [3];
  Token *local_f8;
  undefined1 local_f0 [16];
  size_t local_e0;
  char *local_d8;
  undefined1 *local_d0;
  unsigned_long local_c8 [3];
  Token *local_b0;
  undefined1 local_a8 [16];
  size_t local_98;
  char *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  StringRef *local_78;
  char *local_70;
  char *local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  StringRef *local_48;
  undefined1 local_40 [16];
  char *local_30;
  char *local_28;
  undefined1 *local_20;
  StringRef *local_18;
  StringRef *local_10;
  
  T.Value.field_2._8_8_ = this;
  pTVar2 = peekNext(this);
  Token::Token((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar2);
  Token::Token((Token *)((long)&TagInfo.Value.field_2 + 8));
  Token::Token((Token *)local_3d8);
LAB_0032e3ac:
  do {
    if (AnchorInfo.Value.field_2._8_4_ == 0x14) {
      getNext(&local_410,this);
      Token::~Token(&local_410);
      pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      local_790 = (Document *)0x0;
      if (pDVar6 != (Document *)0x0) {
        pSVar1 = this->stream;
        local_b0 = &T;
        local_c8[2] = 1;
        local_c8[1] = 0xffffffffffffffff;
        puVar3 = std::min<unsigned_long>(local_c8 + 2,(unsigned_long *)&T.Range);
        local_c8[2] = *puVar3;
        pcVar7 = (char *)(T._0_8_ + local_c8[2]);
        local_c8[0] = (long)T.Range.Data - local_c8[2];
        puVar3 = std::min<unsigned_long>(local_c8 + 1,local_c8);
        local_418 = *puVar3;
        local_88 = local_a8;
        Val_00.Length = local_418;
        Val_00.Data = pcVar7;
        local_420 = pcVar7;
        local_98 = local_418;
        local_90 = pcVar7;
        AliasNode::AliasNode((AliasNode *)pDVar6,&pSVar1->CurrentDoc,Val_00);
        local_790 = pDVar6;
      }
      this_local = local_790;
LAB_0032f821:
      local_424 = 1;
      Token::~Token((Token *)local_3d8);
      Token::~Token((Token *)((long)&TagInfo.Value.field_2 + 8));
      Token::~Token((Token *)((long)&AnchorInfo.Value.field_2 + 8));
      return (Node *)this_local;
    }
    if (AnchorInfo.Value.field_2._8_4_ != 0x15) {
      if (AnchorInfo.Value.field_2._8_4_ != 0x16) {
        switch(AnchorInfo.Value.field_2._8_4_) {
        case 0:
          this_local = (Document *)0x0;
          break;
        case 2:
        case 5:
        case 6:
        default:
          pDVar6 = (Document *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
          local_928 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            NullNode::NullNode((NullNode *)pDVar6,&this->stream->CurrentDoc);
            local_928 = pDVar6;
          }
          this_local = local_928;
          break;
        case 7:
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_7c0 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_f8 = &AnchorInfo;
            local_110[2] = 1;
            local_110[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_110 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_110[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_110[2]);
            local_110[0] = (long)AnchorInfo.Range.Data - local_110[2];
            puVar3 = std::min<unsigned_long>(local_110 + 1,local_110);
            local_4e8._24_8_ = *puVar3;
            local_d0 = local_f0;
            local_4e8._0_8_ = TagInfo._0_8_;
            local_4e8._8_8_ = TagInfo.Range.Data;
            Anchor_06.Length = local_4e8._24_8_;
            Anchor_06.Data = pcVar7;
            Tag_06.Length = (size_t)TagInfo.Range.Data;
            Tag_06.Data = (char *)TagInfo._0_8_;
            local_4e8._16_8_ = pcVar7;
            local_e0 = local_4e8._24_8_;
            local_d8 = pcVar7;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_06,Tag_06,ST_Indentless);
            local_7c0 = pDVar6;
          }
          this_local = local_7c0;
          break;
        case 9:
          getNext((Token *)(local_540 + 0x20),this);
          Token::~Token((Token *)(local_540 + 0x20));
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_7e8 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_140 = &AnchorInfo;
            local_158[2] = 1;
            local_158[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_158 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_158[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_158[2]);
            local_158[0] = (long)AnchorInfo.Range.Data - local_158[2];
            puVar3 = std::min<unsigned_long>(local_158 + 1,local_158);
            local_540._24_8_ = *puVar3;
            local_118 = local_138;
            local_540._0_8_ = TagInfo._0_8_;
            local_540._8_8_ = TagInfo.Range.Data;
            Anchor_05.Length = local_540._24_8_;
            Anchor_05.Data = pcVar7;
            Tag_05.Length = (size_t)TagInfo.Range.Data;
            Tag_05.Data = (char *)TagInfo._0_8_;
            local_540._16_8_ = pcVar7;
            local_128 = local_540._24_8_;
            local_120 = pcVar7;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_05,Tag_05,ST_Block);
            local_7e8 = pDVar6;
          }
          this_local = local_7e8;
          break;
        case 10:
          getNext((Token *)(local_598 + 0x20),this);
          Token::~Token((Token *)(local_598 + 0x20));
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_810 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_188 = &AnchorInfo;
            local_1a0[2] = 1;
            local_1a0[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_1a0 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_1a0[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_1a0[2]);
            local_1a0[0] = (long)AnchorInfo.Range.Data - local_1a0[2];
            puVar3 = std::min<unsigned_long>(local_1a0 + 1,local_1a0);
            local_598._24_8_ = *puVar3;
            local_160 = local_180;
            local_598._0_8_ = TagInfo._0_8_;
            local_598._8_8_ = TagInfo.Range.Data;
            Anchor_04.Length = local_598._24_8_;
            Anchor_04.Data = pcVar7;
            Tag_04.Length = (size_t)TagInfo.Range.Data;
            Tag_04.Data = (char *)TagInfo._0_8_;
            local_598._16_8_ = pcVar7;
            local_170 = local_598._24_8_;
            local_168 = pcVar7;
            MappingNode::MappingNode
                      ((MappingNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_04,Tag_04,MT_Block);
            local_810 = pDVar6;
          }
          this_local = local_810;
          break;
        case 0xc:
          getNext((Token *)(local_5f0 + 0x20),this);
          Token::~Token((Token *)(local_5f0 + 0x20));
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_838 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_1d0 = &AnchorInfo;
            local_1e8[2] = 1;
            local_1e8[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_1e8 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_1e8[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_1e8[2]);
            local_1e8[0] = (long)AnchorInfo.Range.Data - local_1e8[2];
            puVar3 = std::min<unsigned_long>(local_1e8 + 1,local_1e8);
            local_5f0._24_8_ = *puVar3;
            local_1a8 = local_1c8;
            local_5f0._0_8_ = TagInfo._0_8_;
            local_5f0._8_8_ = TagInfo.Range.Data;
            Anchor_03.Length = local_5f0._24_8_;
            Anchor_03.Data = pcVar7;
            Tag_03.Length = (size_t)TagInfo.Range.Data;
            Tag_03.Data = (char *)TagInfo._0_8_;
            local_5f0._16_8_ = pcVar7;
            local_1b8 = local_5f0._24_8_;
            local_1b0 = pcVar7;
            SequenceNode::SequenceNode
                      ((SequenceNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_03,Tag_03,ST_Flow);
            local_838 = pDVar6;
          }
          this_local = local_838;
          break;
        case 0xe:
          getNext((Token *)(local_648 + 0x20),this);
          Token::~Token((Token *)(local_648 + 0x20));
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_860 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_218 = &AnchorInfo;
            local_230[2] = 1;
            local_230[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_230 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_230[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_230[2]);
            local_230[0] = (long)AnchorInfo.Range.Data - local_230[2];
            puVar3 = std::min<unsigned_long>(local_230 + 1,local_230);
            local_648._24_8_ = *puVar3;
            local_1f0 = local_210;
            local_648._0_8_ = TagInfo._0_8_;
            local_648._8_8_ = TagInfo.Range.Data;
            Anchor_02.Length = local_648._24_8_;
            Anchor_02.Data = pcVar7;
            Tag_02.Length = (size_t)TagInfo.Range.Data;
            Tag_02.Data = (char *)TagInfo._0_8_;
            local_648._16_8_ = pcVar7;
            local_200 = local_648._24_8_;
            local_1f8 = pcVar7;
            MappingNode::MappingNode
                      ((MappingNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_02,Tag_02,MT_Flow);
            local_860 = pDVar6;
          }
          this_local = local_860;
          break;
        case 0x10:
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_900 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_2f0 = &AnchorInfo;
            local_308[2] = 1;
            local_308[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_308 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_308[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_308[2]);
            local_308[0] = (long)AnchorInfo.Range.Data - local_308[2];
            puVar3 = std::min<unsigned_long>(local_308 + 1,local_308);
            local_2d8 = *puVar3;
            local_2c8 = local_2e8;
            Anchor.Length = local_2d8;
            Anchor.Data = pcVar7;
            Tag.Length = (size_t)TagInfo.Range.Data;
            Tag.Data = (char *)TagInfo._0_8_;
            local_2d0 = pcVar7;
            MappingNode::MappingNode((MappingNode *)pDVar6,&pSVar1->CurrentDoc,Anchor,Tag,MT_Inline)
            ;
            local_900 = pDVar6;
          }
          this_local = local_900;
          break;
        case 0x12:
          getNext(&local_680,this);
          Token::~Token(&local_680);
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_888 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_260 = &AnchorInfo;
            local_278[2] = 1;
            local_278[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_278 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_278[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_278[2]);
            local_278[0] = (long)AnchorInfo.Range.Data - local_278[2];
            puVar3 = std::min<unsigned_long>(local_278 + 1,local_278);
            local_248 = *puVar3;
            local_238 = local_258;
            Anchor_01.Length = local_248;
            Anchor_01.Data = pcVar7;
            Tag_01.Length = (size_t)TagInfo.Range.Data;
            Tag_01.Data = (char *)TagInfo._0_8_;
            Val.Length = (size_t)T.Range.Data;
            Val.Data = (char *)T._0_8_;
            local_240 = pcVar7;
            ScalarNode::ScalarNode((ScalarNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_01,Tag_01,Val);
            local_888 = pDVar6;
          }
          this_local = local_888;
          break;
        case 0x13:
          getNext((Token *)&NullTerminatedStr.Length,this);
          Token::~Token((Token *)&NullTerminatedStr.Length);
          sVar4 = std::__cxx11::string::c_str();
          lVar5 = std::__cxx11::string::length();
          NullTerminatedStr.Data = (char *)(lVar5 + 1);
          StrCopy.Length = sVar4;
          local_718 = StringRef::
                      copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                                ((StringRef *)&StrCopy.Length,&this->NodeAllocator);
          local_78 = &local_718;
          local_80 = 1;
          local_10 = local_78;
          if (local_718.Length == 0) {
            __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                          ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
          }
          local_58 = local_718.Length - 1;
          local_50 = 0;
          local_48 = local_78;
          local_18 = local_78;
          puVar3 = std::min<unsigned_long>(&local_50,&local_718.Length);
          local_50 = *puVar3;
          pcVar7 = local_718.Data + local_50;
          local_60 = local_718.Length - local_50;
          puVar3 = std::min<unsigned_long>(&local_58,&local_60);
          StrCopy.Data = (char *)*puVar3;
          local_20 = local_40;
          local_708 = pcVar7;
          local_70 = pcVar7;
          local_68 = StrCopy.Data;
          local_30 = StrCopy.Data;
          local_28 = pcVar7;
          pDVar6 = (Document *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
          local_8c8 = (Document *)0x0;
          if (pDVar6 != (Document *)0x0) {
            pSVar1 = this->stream;
            local_2a8 = &AnchorInfo;
            local_2c0[2] = 1;
            local_2c0[1] = 0xffffffffffffffff;
            puVar3 = std::min<unsigned_long>(local_2c0 + 2,(unsigned_long *)&AnchorInfo.Range);
            local_2c0[2] = *puVar3;
            pcVar7 = (char *)(AnchorInfo._0_8_ + local_2c0[2]);
            local_2c0[0] = (long)AnchorInfo.Range.Data - local_2c0[2];
            puVar3 = std::min<unsigned_long>(local_2c0 + 1,local_2c0);
            local_290 = *puVar3;
            local_280 = local_2a0;
            Anchor_00.Length = local_290;
            Anchor_00.Data = pcVar7;
            Tag_00.Length = (size_t)TagInfo.Range.Data;
            Tag_00.Data = (char *)TagInfo._0_8_;
            Value.Length = (size_t)StrCopy.Data;
            Value.Data = local_708;
            RawVal.Length = (size_t)T.Range.Data;
            RawVal.Data = (char *)T._0_8_;
            local_288 = pcVar7;
            BlockScalarNode::BlockScalarNode
                      ((BlockScalarNode *)pDVar6,&pSVar1->CurrentDoc,Anchor_00,Tag_00,Value,RawVal);
            local_8c8 = pDVar6;
          }
          this_local = local_8c8;
        }
        goto LAB_0032f821;
      }
      if (local_3d8._0_4_ == TK_Tag) {
        Twine::Twine(&local_490,"Already encountered a tag for this node!");
        setError(this,&local_490,(Token *)((long)&AnchorInfo.Value.field_2 + 8));
        this_local = (Document *)0x0;
        goto LAB_0032f821;
      }
      getNext((Token *)(local_4e8 + 0x20),this);
      Token::operator=((Token *)local_3d8,(Token *)(local_4e8 + 0x20));
      Token::~Token((Token *)(local_4e8 + 0x20));
      pTVar2 = peekNext(this);
      Token::operator=((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar2);
      goto LAB_0032e3ac;
    }
    if (TagInfo.Value.field_2._8_4_ == 0x15) {
      Twine::Twine(&local_440,"Already encountered an anchor for this node!");
      setError(this,&local_440,(Token *)((long)&AnchorInfo.Value.field_2 + 8));
      this_local = (Document *)0x0;
      goto LAB_0032f821;
    }
    getNext(&local_478,this);
    Token::operator=((Token *)((long)&TagInfo.Value.field_2 + 8),&local_478);
    Token::~Token(&local_478);
    pTVar2 = peekNext(this);
    Token::operator=((Token *)((long)&AnchorInfo.Value.field_2 + 8),pTVar2);
  } while( true );
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}